

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

void __thiscall leveldb::DBConstructor::NewDB(DBConstructor *this)

{
  Status SVar1;
  undefined8 *puVar2;
  long *plVar3;
  int line;
  size_type *psVar4;
  char *in_R9;
  Status status;
  AssertionResult gtest_ar_;
  string name;
  Options options;
  Status local_108;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  internal local_f8 [8];
  undefined8 *local_f0;
  AssertHelper local_e8;
  string local_e0;
  string local_c0;
  string local_a0;
  Options local_80;
  
  testing::TempDir_abi_cxx11_();
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_e0.field_2._M_allocated_capacity = *psVar4;
    local_e0.field_2._8_8_ = plVar3[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar4;
    local_e0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_e0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_80.comparator != (Comparator *)&local_80.env) {
    operator_delete(local_80.comparator);
  }
  Options::Options(&local_80);
  local_80.comparator = this->comparator_;
  DestroyDB((leveldb *)&local_108,&local_e0,&local_80);
  local_f8[0] = (internal)(local_108.state_ == (char *)0x0);
  local_f0 = (undefined8 *)0x0;
  if ((bool)local_f8[0]) {
    local_80.create_if_missing = true;
    local_80.error_if_exists = true;
    local_80.write_buffer_size = 10000;
    DB::Open((DB *)&local_c0,&local_80,&local_e0,&this->db_);
    SVar1.state_ = local_108.state_;
    local_108.state_ = local_c0._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = SVar1.state_;
    if (SVar1.state_ != (char *)0x0) {
      operator_delete__(SVar1.state_);
    }
    local_f8[0] = (internal)(local_108.state_ == (char *)0x0);
    local_f0 = (undefined8 *)0x0;
    if ((bool)local_f8[0]) goto LAB_001118ae;
    testing::Message::Message((Message *)&local_100);
    Status::ToString_abi_cxx11_(&local_c0,&local_108);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_100._M_head_impl + 0x10),local_c0._M_dataplus._M_p,
               local_c0._M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,local_f8,(AssertionResult *)"status.ok()","false","true",in_R9);
    line = 0x16e;
  }
  else {
    testing::Message::Message((Message *)&local_100);
    Status::ToString_abi_cxx11_(&local_c0,&local_108);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_100._M_head_impl + 0x10),local_c0._M_dataplus._M_p,
               local_c0._M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,local_f8,(AssertionResult *)"status.ok()","false","true",in_R9);
    line = 0x168;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_e8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/table_test.cc"
             ,line,local_a0._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_100);
  testing::internal::AssertHelper::~AssertHelper(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_100._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_100._M_head_impl + 8))();
  }
LAB_001118ae:
  puVar2 = local_f0;
  if (local_f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_f0 != local_f0 + 2) {
      operator_delete((undefined8 *)*local_f0);
    }
    operator_delete(puVar2);
  }
  if (local_108.state_ != (char *)0x0) {
    operator_delete__(local_108.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void NewDB() {
    std::string name = testing::TempDir() + "table_testdb";

    Options options;
    options.comparator = comparator_;
    Status status = DestroyDB(name, options);
    ASSERT_TRUE(status.ok()) << status.ToString();

    options.create_if_missing = true;
    options.error_if_exists = true;
    options.write_buffer_size = 10000;  // Something small to force merging
    status = DB::Open(options, name, &db_);
    ASSERT_TRUE(status.ok()) << status.ToString();
  }